

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void screen_wipe(tgestate_t *state,uint8_t *dst,uint8_t width,uint8_t height)

{
  uint8_t *puVar1;
  uint8_t *__s;
  ushort uVar2;
  short sVar3;
  undefined7 in_register_00000011;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar4;
  
  __s = dst;
  uVar5 = height;
  do {
    memset(__s,0,CONCAT71(in_register_00000011,width) & 0xffffffff);
    puVar1 = (state->speccy->screen).pixels;
    uVar6 = (int)__s - (int)puVar1;
    uVar2 = (ushort)(uVar6 + 0x100);
    if ((uVar6 + 0x100 & 0x700) == 0) {
      sVar3 = (short)uVar6 + 0x20;
      if ((~uVar6 & 0xe0) != 0) {
        sVar3 = uVar2 - 0x7e0;
      }
      uVar4 = (ulong)sVar3;
    }
    else {
      uVar4 = (ulong)uVar2;
    }
    __s = puVar1 + uVar4;
    uVar5 = uVar5 + 0xff;
  } while (uVar5 != '\0');
  invalidate_bitmap(state,dst,(uint)width << 3,(uint)height);
  return;
}

Assistant:

void screen_wipe(tgestate_t *state,
                 uint8_t    *dst,
                 uint8_t     width,
                 uint8_t     height)
{
  uint8_t  h;
  uint8_t *curr_dst;

  assert(state != NULL);
  assert(dst   != NULL);
  assert(width  > 0);
  assert(height > 0);

  h        = height;
  curr_dst = dst;
  do
  {
    memset(curr_dst, 0, width);
    curr_dst = get_next_scanline(state, curr_dst);
  }
  while (--h);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, dst, width * 8, height);
}